

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endianness.cc
# Opt level: O3

bool __thiscall
Typelib::CompileEndianSwapVisitor::visit_(CompileEndianSwapVisitor *this,Compound *type)

{
  size_t sVar1;
  _List_node_base *p_Var2;
  ulong uVar3;
  Field *this_00;
  FieldList *pFVar4;
  size_t sVar5;
  Type *pTVar6;
  ulong uVar7;
  
  sVar1 = this->m_output_index;
  pFVar4 = Compound::getFields_abi_cxx11_(type);
  for (p_Var2 = (pFVar4->super__List_base<Typelib::Field,_std::allocator<Typelib::Field>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)pFVar4;
      p_Var2 = (((_List_base<Typelib::Field,_std::allocator<Typelib::Field>_> *)&p_Var2->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next) {
    this_00 = (Field *)(p_Var2 + 1);
    sVar5 = Field::getOffset(this_00);
    uVar7 = sVar5 + sVar1;
    uVar3 = this->m_output_index;
    if (uVar3 <= uVar7) {
      if (uVar3 < uVar7) {
        skip(this,(int)uVar7 - (int)uVar3);
      }
      this->m_output_index = uVar7;
      pTVar6 = Field::getType(this_00);
      TypeVisitor::dispatch(&this->super_TypeVisitor,pTVar6);
      pTVar6 = Field::getType(this_00);
      sVar5 = Type::getSize(pTVar6);
      this->m_output_index = sVar5 + uVar7;
    }
  }
  return true;
}

Assistant:

bool CompileEndianSwapVisitor::visit_ (Compound const& type)
    {
        size_t base_index = m_output_index;

        typedef Compound::FieldList Fields;
        Fields const& fields(type.getFields());
        Fields::const_iterator const end = fields.end();

        for (Fields::const_iterator it = fields.begin(); it != end; ++it)
        {
            size_t new_index = base_index + it->getOffset();
            if (new_index < m_output_index)
                continue;
            else if (new_index > m_output_index)
                skip(new_index - m_output_index);

            m_output_index = new_index;
            dispatch(it->getType());
            m_output_index = new_index + it->getType().getSize();
        }
        return true;
    }